

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::StructBuilderBody
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *field;
  StructDef *struct_def_00;
  pointer ppFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  char *local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  IdlNamer *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = nameprefix;
  NumToString<unsigned_long>(&local_98,struct_def->minalign);
  std::operator+(&local_78,"\tbuilder.Prep(",&local_98);
  std::operator+(&local_c0,&local_78,", ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  NumToString<unsigned_long>(&local_78,struct_def->bytesize);
  std::operator+(&local_c0,&local_78,")\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_78);
  ppFVar1 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_58 = &this->namer_;
  while (ppFVar1 !=
         (struct_def->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    field = ppFVar1[-1];
    if (field->padding != 0) {
      NumToString<unsigned_long>(&local_98,field->padding);
      std::operator+(&local_78,"\tbuilder.Pad(",&local_98);
      std::operator+(&local_c0,&local_78,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    ppFVar1 = ppFVar1 + -1;
    if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (field->value).type.struct_def, struct_def_00->fixed == true)) {
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field,"_")
      ;
      std::operator+(&local_c0,local_a0,&local_78);
      StructBuilderBody(this,struct_def_00,local_c0._M_dataplus._M_p,code_ptr);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      GenMethod_abi_cxx11_(&local_98,this,field);
      std::operator+(&local_78,"\tbuilder.Prepend",&local_98);
      std::operator+(&local_c0,&local_78,"(");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      (*(local_58->super_Namer)._vptr_Namer[7])(&local_98,local_58,field);
      std::operator+(&local_50,local_a0,&local_98);
      CastToBaseType(&local_78,this,&(field->value).type,&local_50);
      std::operator+(&local_c0,&local_78,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\tbuilder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "\tbuilder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (field.name + "_")).c_str(), code_ptr);
      } else {
        code += "\tbuilder.Prepend" + GenMethod(field) + "(";
        code += CastToBaseType(field.value.type,
                               nameprefix + namer_.Variable(field)) +
                ")\n";
      }
    }
  }